

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O2

void Parser::print(TreeNode *treeNode,int deep)

{
  string *__lhs;
  int *piVar1;
  bool bVar2;
  ostream *poVar3;
  int i;
  int iVar4;
  int *piVar5;
  
  for (iVar4 = 1; iVar4 < deep; iVar4 = iVar4 + 1) {
    std::operator<<((ostream *)&std::cout,"  ");
  }
  std::operator<<((ostream *)&std::cout,(string *)&treeNode->name);
  __lhs = &treeNode->attr;
  bVar2 = std::operator!=(__lhs,"_");
  if (bVar2) {
    bVar2 = std::operator!=(__lhs," ");
    if (bVar2) {
      poVar3 = std::operator<<((ostream *)&std::cout," :");
      std::operator<<(poVar3,(string *)__lhs);
    }
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"(");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,treeNode->lineNum);
  poVar3 = std::operator<<(poVar3,",");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,treeNode->opt);
  poVar3 = std::operator<<(poVar3,")");
  std::endl<char,std::char_traits<char>>(poVar3);
  piVar1 = (treeNode->sons).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (piVar5 = (treeNode->sons).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start; piVar5 != piVar1; piVar5 = piVar5 + 1) {
    print(resultTree.super__Vector_base<TreeNode,_std::allocator<TreeNode>_>._M_impl.
          super__Vector_impl_data._M_start + *piVar5,deep + 1);
  }
  return;
}

Assistant:

void print(const TreeNode &treeNode,int deep){
        for(int i = 1;i < deep;i++){
            cout<<"  ";
        }
        cout<<treeNode.name;
        if(treeNode.attr!="_"&&treeNode.attr!=" "){
            cout<<" :"<<treeNode.attr;
        }
        cout<<"("<<treeNode.lineNum<<","<<treeNode.opt<<")"<<endl;
        for(int t:treeNode.sons){
            print(resultTree[t],deep+1);
        }
    }